

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_CopyOutput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  PaUtilChannelDescriptor *pPVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong local_58;
  uint local_4c;
  uint i;
  uint srcChannelStrideBytes;
  uint srcSampleStrideSamples;
  void **nonInterleavedSrcPtrs;
  uchar *srcBytePtr;
  uint framesToCopy;
  PaUtilChannelDescriptor *hostOutputChannels;
  unsigned_long frameCount_local;
  void **buffer_local;
  PaUtilBufferProcessor *bp_local;
  
  pPVar3 = bp->hostOutputChannels[0];
  local_58 = frameCount;
  if (bp->hostOutputFrameCount[0] < frameCount) {
    local_58 = bp->hostOutputFrameCount[0];
  }
  uVar6 = (uint)local_58;
  if (bp->userOutputIsInterleaved == 0) {
    pvVar4 = *buffer;
    for (local_4c = 0; local_4c < bp->outputChannelCount; local_4c = local_4c + 1) {
      pvVar5 = *(void **)((long)pvVar4 + (ulong)local_4c * 8);
      (*bp->outputConverter)
                (pPVar3[local_4c].data,pPVar3[local_4c].stride,pvVar5,1,uVar6,&bp->ditherGenerator);
      *(ulong *)((long)pvVar4 + (ulong)local_4c * 8) =
           (long)pvVar5 + (ulong)(bp->bytesPerUserOutputSample * uVar6);
      pPVar3[local_4c].data =
           (void *)((long)pPVar3[local_4c].data +
                   (ulong)(uVar6 * pPVar3[local_4c].stride * bp->bytesPerHostOutputSample));
    }
  }
  else {
    nonInterleavedSrcPtrs = (void **)*buffer;
    uVar1 = bp->outputChannelCount;
    uVar2 = bp->bytesPerUserOutputSample;
    for (local_4c = 0; local_4c < bp->outputChannelCount; local_4c = local_4c + 1) {
      (*bp->outputConverter)
                (pPVar3[local_4c].data,pPVar3[local_4c].stride,nonInterleavedSrcPtrs,uVar1,uVar6,
                 &bp->ditherGenerator);
      nonInterleavedSrcPtrs = (void **)((long)nonInterleavedSrcPtrs + (ulong)uVar2);
      pPVar3[local_4c].data =
           (void *)((long)pPVar3[local_4c].data +
                   (ulong)(uVar6 * pPVar3[local_4c].stride * bp->bytesPerHostOutputSample));
    }
    *buffer = (void *)((long)*buffer +
                      (ulong)(uVar6 * bp->outputChannelCount * bp->bytesPerUserOutputSample));
  }
  bp->hostOutputFrameCount[0] = (local_58 & 0xffffffff) + bp->hostOutputFrameCount[0];
  return local_58 & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyOutput( PaUtilBufferProcessor* bp,
        const void ** buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToCopy;
    unsigned char *srcBytePtr;
    void **nonInterleavedSrcPtrs;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToCopy = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    if( bp->userOutputIsInterleaved )
    {
        srcBytePtr = (unsigned char*)*buffer;

        srcSampleStrideSamples = bp->outputChannelCount;
        srcChannelStrideBytes = bp->bytesPerUserOutputSample;

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );

            srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }

        /* advance callers source pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->outputChannelCount * bp->bytesPerUserOutputSample;

    }
    else
    {
        /* user output is not interleaved */

        nonInterleavedSrcPtrs = (void**)*buffer;

        srcSampleStrideSamples = 1;

        for( i=0; i<bp->outputChannelCount; ++i )
        {
            srcBytePtr = (unsigned char*)nonInterleavedSrcPtrs[i];

            bp->outputConverter(    hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    srcBytePtr, srcSampleStrideSamples,
                                    framesToCopy, &bp->ditherGenerator );


            /* advance callers source pointer (nonInterleavedSrcPtrs[i]) */
            srcBytePtr += bp->bytesPerUserOutputSample * framesToCopy;
            nonInterleavedSrcPtrs[i] = srcBytePtr;

            /* advance dest ptr for next iteration */
            hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                    framesToCopy * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
        }
    }

    bp->hostOutputFrameCount[0] += framesToCopy;

    return framesToCopy;
}